

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_new_promise_capability(JSContext *ctx,JSValue *resolving_funcs,JSValue ctor)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  JSValue JVar4;
  JSValue JVar5;
  bool bVar6;
  int iVar7;
  JSRefCountHeader *p_1;
  long lVar8;
  ulong uVar9;
  int64_t iVar10;
  JSValueUnion JVar11;
  long lVar13;
  bool bVar14;
  JSValue obj;
  JSValue v;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValueUnion local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  int64_t iVar12;
  
  JVar11 = ctor.u;
  local_58.ptr = (void *)(local_58 << 0x20);
  local_50 = 3;
  local_48 = 0;
  local_40 = 3;
  iVar7 = 0;
  JVar15 = JS_NewCFunctionData(ctx,js_promise_executor,2,0,2,(JSValue *)&local_58);
  if ((int)JVar15.tag != 6) {
    _local_58 = JVar15;
    if ((int)ctor.tag == 3) {
      JVar16 = js_promise_constructor(ctx,ctor,iVar7,(JSValue *)&local_58);
      iVar12 = JVar16.tag;
    }
    else {
      JVar15 = JS_CallConstructorInternal(ctx,ctor,ctor,1,(JSValue *)&local_58,2);
      iVar12 = JVar15.tag;
      JVar16.tag = (int64_t)JVar11.ptr;
      JVar16.u.float64 = JVar15.u.float64;
      JVar15 = _local_58;
    }
    iVar10 = JVar16.tag;
    JVar11 = JVar16.u;
    if ((uint)iVar12 == 6) {
LAB_0012f502:
      JVar11 = JVar16.u;
      if (0xfffffff4 < (uint)JVar15.tag) {
        uVar2 = *JVar15.u.ptr;
        uVar1 = uVar2 - 1;
        uVar9 = (ulong)uVar1;
        JVar16.tag._0_4_ = uVar1;
        JVar16.u.ptr = JVar11.ptr;
        JVar16.tag._4_4_ = 0;
        *(uint *)JVar15.u.ptr = uVar1;
        if ((int)uVar2 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar15);
          JVar16.tag = uVar9;
        }
      }
      JVar11 = JVar16.u;
      if ((0xfffffff4 < (uint)iVar12) &&
         (iVar7 = *JVar11.ptr, *(int *)JVar11.ptr = iVar7 + -1, iVar7 < 2)) {
        v.tag = iVar12;
        v.u.ptr = JVar11.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      JVar15 = (JSValue)(ZEXT816(6) << 0x40);
      uVar9 = 0;
      goto LAB_0012f54d;
    }
    if (((int)JVar15.tag == -1) && (*(short *)((long)JVar15.u.ptr + 6) == 0xf)) {
      lVar13 = *(long *)((long)JVar15.u.ptr + 0x30);
    }
    else {
      lVar13 = 0;
    }
    JVar4.tag = iVar12;
    JVar4.u.ptr = JVar11.ptr;
    lVar8 = 0;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      obj.tag = *(int64_t *)(lVar13 + 0x18 + lVar8 * 0x10);
      obj.u.ptr = ((JSValueUnion *)(lVar13 + 0x10 + lVar8 * 0x10))->ptr;
      iVar7 = check_function(ctx,obj);
      JVar16.tag = iVar10;
      JVar16.u.ptr = JVar11.ptr;
      JVar15 = _local_58;
      if (iVar7 != 0) goto LAB_0012f502;
      lVar8 = 1;
      bVar6 = false;
    } while (bVar14);
    lVar8 = 0;
    JVar5.tag = iVar12;
    JVar5.u.ptr = JVar11.ptr;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      piVar3 = *(int **)(lVar13 + 0x10 + lVar8 * 0x10);
      iVar10 = *(int64_t *)(lVar13 + 0x18 + lVar8 * 0x10);
      if (0xfffffff4 < (uint)iVar10) {
        *piVar3 = *piVar3 + 1;
      }
      resolving_funcs[lVar8].u.ptr = piVar3;
      resolving_funcs[lVar8].tag = iVar10;
      lVar8 = 1;
      bVar6 = false;
    } while (bVar14);
    JVar15 = JVar4;
    if (0xfffffff4 < local_58._8_4_) {
      iVar7 = *local_58.ptr;
      *(int *)local_58.ptr = iVar7 + -1;
      JVar15 = JVar5;
      if (iVar7 < 2) {
        __JS_FreeValueRT(ctx->rt,_local_58);
        JVar15.tag = iVar12;
        JVar15.u.ptr = JVar11.ptr;
      }
    }
  }
  uVar9 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
LAB_0012f54d:
  JVar17.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar9);
  JVar17.tag = JVar15.tag;
  return JVar17;
}

Assistant:

static JSValue js_new_promise_capability(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst ctor)
{
    JSValue executor, result_promise;
    JSCFunctionDataRecord *s;
    int i;

    executor = js_promise_executor_new(ctx);
    if (JS_IsException(executor))
        return executor;

    if (JS_IsUndefined(ctor)) {
        result_promise = js_promise_constructor(ctx, ctor, 1,
                                                (JSValueConst *)&executor);
    } else {
        result_promise = JS_CallConstructor(ctx, ctor, 1,
                                            (JSValueConst *)&executor);
    }
    if (JS_IsException(result_promise))
        goto fail;
    s = JS_GetOpaque(executor, JS_CLASS_C_FUNCTION_DATA);
    for(i = 0; i < 2; i++) {
        if (check_function(ctx, s->data[i]))
            goto fail;
    }
    for(i = 0; i < 2; i++)
        resolving_funcs[i] = JS_DupValue(ctx, s->data[i]);
    JS_FreeValue(ctx, executor);
    return result_promise;
 fail:
    JS_FreeValue(ctx, executor);
    JS_FreeValue(ctx, result_promise);
    return JS_EXCEPTION;
}